

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68000_andi_16(m68k_info *info)

{
  uint imm;
  ulong uVar1;
  
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  imm = 0xaaaa;
  if (uVar1 + 2 <= info->code_len) {
    imm = (uint)(ushort)(*(ushort *)(info->code + uVar1) << 8 | *(ushort *)(info->code + uVar1) >> 8
                        );
  }
  info->pc = info->pc + 2;
  build_imm_ea(info,8,'\x02',imm);
  return;
}

Assistant:

static unsigned int peek_imm_16(const m68k_info *info) { return m68k_read_safe_16((info), (info)->pc); }